

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-command.c
# Opt level: O3

void html_screenshot(char *path,wchar_t mode,term_conflict *other_term)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  int iVar9;
  wchar_t wVar10;
  char *s;
  ang_file *paVar11;
  ulong uVar12;
  int iVar13;
  wchar_t wVar14;
  wchar_t y;
  char *pcVar15;
  wchar_t x;
  int iVar16;
  int iVar17;
  wchar_t y_00;
  wchar_t c;
  wchar_t a;
  wchar_t local_80;
  wchar_t other_wid;
  wchar_t local_78;
  wchar_t other_hgt;
  wchar_t main_hgt;
  wchar_t main_wid;
  ulong local_68;
  uint local_60;
  int local_5c;
  term *local_58;
  ang_file *local_50;
  term_conflict *local_48;
  char *local_40;
  char *local_38;
  
  a = L'\x01';
  c = L' ';
  local_58 = Term;
  local_40 = "[/COLOR][COLOR=\"#%02X%02X%02X\"]";
  if (mode == L'\0') {
    local_40 = "</font><font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">";
  }
  wVar8 = text_wcsz();
  s = (char *)mem_alloc((long)(wVar8 + L'\x01'));
  paVar11 = file_open(path,MODE_WRITE,FTYPE_TEXT);
  if (paVar11 == (ang_file *)0x0) {
    mem_free(s);
    plog_fmt("Cannot write the \'%s\' file!",path);
    return;
  }
  Term_get_size(&main_wid,&main_hgt);
  local_50 = paVar11;
  if (other_term == (term_conflict *)0x0) {
    other_wid = L'\0';
    other_hgt = L'\0';
  }
  else {
    Term_activate((term *)other_term);
    Term_get_size(&other_wid,&other_hgt);
    Term_activate(local_58);
  }
  paVar11 = local_50;
  local_68 = (ulong)(uint)main_wid;
  wVar8 = other_hgt;
  if (other_hgt < main_hgt) {
    wVar8 = main_hgt;
  }
  local_80 = main_wid + L'\x01' + other_wid;
  if (other_wid < L'\x01') {
    local_80 = main_wid;
  }
  if (mode == L'\0') {
    file_putf(local_50,"<!DOCTYPE html><html><head>\n");
    file_putf(paVar11,"  <meta http-equiv=\'Content-Type\' content=\'text/html; charset=utf-8\'>\n")
    ;
    file_putf(paVar11,"  <meta name=\'generator\' content=\'%s\'>\n",buildid);
    file_putf(paVar11,"  <title>%s</title>\n",path);
    file_putf(paVar11,"</head>\n\n");
    file_putf(paVar11,"<body style=\'color: #%02X%02X%02X; background: #%02X%02X%02X;\'>\n",
              (ulong)angband_color_table[1][1],(ulong)angband_color_table[1][2],
              (ulong)angband_color_table[1][3],(ulong)angband_color_table[0][1],
              (ulong)angband_color_table[0][2],(ulong)angband_color_table[0][3]);
    file_putf(paVar11,"<pre>\n");
  }
  else {
    file_putf(local_50,"[CODE][TT][BC=\"#%02X%02X%02X\"][COLOR=\"#%02X%02X%02X\"]\n",
              (ulong)angband_color_table[0][1],(ulong)angband_color_table[0][2],
              (ulong)angband_color_table[0][3],(ulong)angband_color_table[1][1],
              (ulong)angband_color_table[1][2],(ulong)angband_color_table[1][3]);
  }
  if (wVar8 < L'\x01') {
LAB_001d5f5a:
    if (mode != L'\0') {
      pcVar15 = "[/COLOR][/BC][/TT][/CODE]\n";
      goto LAB_001d5f90;
    }
  }
  else {
    local_5c = (uint)local_68 + 1;
    local_38 = s + 1;
    local_60 = ~(uint)local_68;
    wVar14 = L'\x01';
    y_00 = L'\0';
    iVar17 = 0;
    local_78 = wVar8;
    local_48 = other_term;
    do {
      if (L'\0' < local_80) {
        wVar8 = L'\0';
        iVar16 = iVar17;
        do {
          if ((wVar8 < main_wid) && (y_00 < main_hgt)) {
            iVar17 = Term->sidebar_mode;
            wVar10 = row_top_map[iVar17];
            y = y_00;
            x = wVar8;
            if ((((y_00 < wVar10) || (local_78 - row_bottom_map[iVar17] <= y_00)) ||
                (wVar7 = col_map[iVar17], wVar8 < wVar7)) ||
               ((x = (uint)tile_width * (wVar8 - wVar7) + wVar7, x < local_80 &&
                (y = (y_00 - wVar10) * (uint)tile_height + wVar10,
                y < local_78 - row_bottom_map[iVar17])))) {
              Term_what(x,y,&a,&c);
LAB_001d5c4e:
              wVar10 = a + L'ÿ';
              if (L'\xffffffff' < a) {
                wVar10 = a;
              }
              iVar9 = a % 0x20;
              iVar13 = wVar10 >> 8;
              if (iVar13 != 0) {
                if (iVar13 == 2) {
                  iVar17 = 0x1c;
                }
                else {
                  iVar17 = iVar9;
                  if ((iVar13 != 1) && (iVar17 = iVar16, 0x2ff < (uint)a)) {
                    __assert_fail("(a >= 0) && (a < BG_MAX * MULT_BG)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-command.c"
                                  ,0x19d,"void html_screenshot(const char *, int, term *)");
                  }
                }
                goto LAB_001d5d3a;
              }
            }
            else {
              a = L'\x01';
              c = L' ';
              iVar9 = 1;
            }
            iVar17 = 0;
          }
          else {
            if (((wchar_t)local_68 < wVar8) &&
               ((wVar8 < other_wid + local_5c && (y_00 < other_hgt)))) {
              wVar10 = local_60 + wVar8;
              if (wVar10 == L'\0') {
                Term_activate((term *)local_48);
              }
              Term_what(wVar10,y_00,&a,&c);
              paVar11 = local_50;
              if (wVar8 == other_wid + (wchar_t)local_68) {
                Term_activate(local_58);
              }
              goto LAB_001d5c4e;
            }
            a = L'\x01';
            c = L' ';
            iVar9 = 1;
            iVar17 = 0;
          }
LAB_001d5d3a:
          if (wVar14 == a) {
LAB_001d5e76:
            wVar10 = c;
            if (mode != L'\0') goto LAB_001d5e7a;
            if (c != L'&') {
              if (c == L'>') {
                pcVar15 = "&gt;";
                goto LAB_001d5edf;
              }
              if (c == L'<') {
                pcVar15 = "&lt;";
                goto LAB_001d5edf;
              }
              wVar10 = text_wctomb(s,c);
              if (wVar10 < L'\x01') {
                *s = ' ';
                uVar12 = 1;
              }
              else {
                uVar12 = (ulong)(uint)wVar10;
              }
              s[uVar12] = '\0';
              goto LAB_001d5eb3;
            }
            pcVar15 = "&amp;";
LAB_001d5edf:
            file_putf(paVar11,pcVar15);
          }
          else {
            wVar10 = L' ';
            if (c != L' ' || mode == L'\0') {
              if ((mode == L'\0') && (wVar14 == L'\x01')) {
                bVar1 = angband_color_table[iVar9][1];
                bVar2 = angband_color_table[iVar9][2];
                bVar3 = angband_color_table[iVar9][3];
                bVar4 = angband_color_table[iVar17][1];
                bVar5 = angband_color_table[iVar17][2];
                bVar6 = angband_color_table[iVar17][3];
                pcVar15 = "<font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">"
                ;
              }
              else {
                if ((iVar9 == 1) && (iVar17 == 0 && mode == L'\0')) {
                  file_putf(paVar11,"%s","</font>");
                  wVar14 = a;
                  goto LAB_001d5e76;
                }
                bVar1 = angband_color_table[iVar9][1];
                bVar2 = angband_color_table[iVar9][2];
                bVar3 = angband_color_table[iVar9][3];
                bVar4 = angband_color_table[iVar17][1];
                bVar5 = angband_color_table[iVar17][2];
                bVar6 = angband_color_table[iVar17][3];
                pcVar15 = local_40;
              }
              file_putf(paVar11,pcVar15,(ulong)bVar1,(ulong)bVar2,(ulong)bVar3,(ulong)bVar4,
                        (ulong)bVar5,(ulong)bVar6);
              wVar14 = a;
              goto LAB_001d5e76;
            }
LAB_001d5e7a:
            wVar10 = text_wctomb(s,wVar10);
            if (wVar10 < L'\x01') {
              *s = ' ';
              pcVar15 = local_38;
            }
            else {
              pcVar15 = s + (uint)wVar10;
            }
            *pcVar15 = '\0';
LAB_001d5eb3:
            file_putf(paVar11,"%s",s);
          }
          wVar8 = wVar8 + L'\x01';
          iVar16 = iVar17;
        } while (local_80 != wVar8);
      }
      file_putf(paVar11,"\n");
      y_00 = y_00 + L'\x01';
    } while (y_00 != local_78);
    if ((mode != L'\0') || (wVar14 == L'\x01')) goto LAB_001d5f5a;
    file_putf(paVar11,"%s","</font>");
  }
  file_putf(paVar11,"</pre>\n");
  file_putf(paVar11,"</body>\n");
  pcVar15 = "</html>\n";
LAB_001d5f90:
  file_putf(paVar11,pcVar15);
  file_close(paVar11);
  mem_free(s);
  return;
}

Assistant:

void html_screenshot(const char *path, int mode, term *other_term)
{
	/* Put the contents of the other terminal on the right by default. */
	bool other_left = false;
	int y, x;
	int main_wid, main_hgt, other_wid, other_hgt, wid, hgt;
	int main_xst, other_xst;
	int a = COLOUR_WHITE;
	int oa = COLOUR_WHITE;
	int fg_colour = COLOUR_WHITE;
	int bg_colour = COLOUR_DARK;
	wchar_t c = L' ';
	term *main_term = Term;

	const char *new_color_fmt = "<font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">";
	const char *change_color_fmt = (mode == 0) ?
					"</font><font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">"
					: "[/COLOR][COLOR=\"#%02X%02X%02X\"]";
	const char *close_color_str = "</font>";

	char *mbbuf;
	ang_file *fp;

	mbbuf = mem_alloc(text_wcsz() + 1);
	fp = file_open(path, MODE_WRITE, FTYPE_TEXT);

	/* Oops */
	if (!fp) {
		mem_free(mbbuf);
		plog_fmt("Cannot write the '%s' file!", path);
		return;
	}

	/* Retrieve current screen size */
	Term_get_size(&main_wid, &main_hgt);
	if (other_term) {
		Term_activate(other_term);
		Term_get_size(&other_wid, &other_hgt);
		Term_activate(main_term);
	} else {
		other_wid = 0;
		other_hgt = 0;
	}
	if (other_left) {
		other_xst = 0;
		main_xst = (other_wid > 0) ? other_wid + 1 : 0;
	} else {
		other_xst = main_wid + 1;
		main_xst = 0;
	}
	hgt = MAX(main_hgt, other_hgt);
	wid = (other_wid > 0) ? main_wid + other_wid + 1 : main_wid;

	if (mode == 0) {
		file_putf(fp, "<!DOCTYPE html><html><head>\n");
		file_putf(fp, "  <meta http-equiv='Content-Type' content='text/html; charset=utf-8'>\n");
		file_putf(fp, "  <meta name='generator' content='%s'>\n", buildid);
		file_putf(fp, "  <title>%s</title>\n", path);
		file_putf(fp, "</head>\n\n");
		file_putf(fp, "<body style='color: #%02X%02X%02X; background: #%02X%02X%02X;'>\n",
			angband_color_table[COLOUR_WHITE][1],
			angband_color_table[COLOUR_WHITE][2],
			angband_color_table[COLOUR_WHITE][3],
			angband_color_table[COLOUR_DARK][1],
			angband_color_table[COLOUR_DARK][2],
			angband_color_table[COLOUR_DARK][3]);
		file_putf(fp, "<pre>\n");
	} else {
		file_putf(fp, "[CODE][TT][BC=\"#%02X%02X%02X\"][COLOR=\"#%02X%02X%02X\"]\n",
			angband_color_table[COLOUR_DARK][1],
			angband_color_table[COLOUR_DARK][2],
			angband_color_table[COLOUR_DARK][3],
			angband_color_table[COLOUR_WHITE][1],
			angband_color_table[COLOUR_WHITE][2],
			angband_color_table[COLOUR_WHITE][3]);
	}

	/* Dump the screen */
	for (y = 0; y < hgt; y++) {
		for (x = 0; x < wid; x++) {
			/* Get the attr/char */
			if (x >= main_xst && x < main_xst + main_wid
					&& y < main_hgt) {
				screenshot_term_query(wid, hgt, x - main_xst, y,
					&a, &c);
			} else if (x >= other_xst && x < other_xst + other_wid
					&& y < other_hgt) {
				if (x == other_xst) {
					Term_activate(other_term);
				}
				Term_what(x - other_xst, y, &a, &c);
				if (x == other_xst + other_wid - 1) {
					Term_activate(main_term);
				}
			} else {
				a = COLOUR_WHITE;
				c = ' ';
			}

			/* Set the foreground and background */
			fg_colour = a % MAX_COLORS;
			switch (a / MULT_BG)
			{
				case BG_BLACK:
					bg_colour = COLOUR_DARK;
					break;
				case BG_SAME:
					bg_colour = fg_colour;
					break;
				case BG_DARK:
					bg_colour = COLOUR_SHADE;
					break;
				default:
					assert((a >= 0)
						&& (a < BG_MAX * MULT_BG));
			}

			/*
			 * Color change (for forum text, ignore changes if the character is
			 * a space since the forum software strips [COLOR][/COLOR] elements that
			 * only contain whitespace)
			 */
			if (oa != a && (mode == 0 || c != L' ')) {
				if (oa == COLOUR_WHITE && mode == 0) {
					/* From the default white to another color */
					file_putf(fp, new_color_fmt,
							  angband_color_table[fg_colour][1],
							  angband_color_table[fg_colour][2],
							  angband_color_table[fg_colour][3],
							  angband_color_table[bg_colour][1],
							  angband_color_table[bg_colour][2],
							  angband_color_table[bg_colour][3]);
				} else if (fg_colour == COLOUR_WHITE
						&& bg_colour == COLOUR_DARK
						&& mode == 0) {
					/* From another color to the default white */
					file_putf(fp, "%s", close_color_str);
				} else {
					/* Change colors */
					file_putf(fp, change_color_fmt,
							  angband_color_table[fg_colour][1],
							  angband_color_table[fg_colour][2],
							  angband_color_table[fg_colour][3],
							  angband_color_table[bg_colour][1],
							  angband_color_table[bg_colour][2],
							  angband_color_table[bg_colour][3]);
				}

				/* Remember the last color */
				oa = a;
			}

			/* Write the character and escape special HTML characters */
			if (mode == 0) write_html_escape_char(fp, mbbuf, c);
			else {
				int nc = text_wctomb(mbbuf, c);

				if (nc > 0) {
					mbbuf[nc] = 0;
				} else {
					mbbuf[0] = ' ';
					mbbuf[1] = 0;
				}
				file_putf(fp, "%s", mbbuf);
			}
		}

		/* End the row */
		file_putf(fp, "\n");
	}

	/* Close the last font-color tag if necessary */
	if (oa != COLOUR_WHITE && mode == 0) file_putf(fp, "%s", close_color_str);

	if (mode == 0) {
		file_putf(fp, "</pre>\n");
		file_putf(fp, "</body>\n");
		file_putf(fp, "</html>\n");
	} else {
		file_putf(fp, "[/COLOR][/BC][/TT][/CODE]\n");
	}

	/* Close it */
	file_close(fp);

	mem_free(mbbuf);
}